

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  string *psVar1;
  cmCPackLog *pcVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  undefined7 in_register_00000031;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string packageFileName;
  string localToplevel;
  char *local_4f0 [4];
  cmArchiveWrite archive;
  ostringstream cmCPackLog_msg;
  cmGeneratedFileStream gf;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    psVar1 = &(this->super_cmCPackGenerator).toplevel;
    for (p_Var9 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var9 !=
        &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
      poVar7 = std::operator<<((ostream *)&gf,"Packaging component group: ");
      poVar7 = std::operator<<(poVar7,(string *)(p_Var9 + 1));
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x83,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)psVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,"/");
      GetArchiveComponentFileName((string *)&archive,this,(string *)(p_Var9 + 1),true);
      std::operator+(&localToplevel,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&archive);
      std::__cxx11::string::~string((string *)&archive);
      std::__cxx11::string::~string((string *)&gf);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
      cmGeneratedFileStream::Open(&gf,&localToplevel,false,true);
      iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gf);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Problem to generate Header for archive <");
        poVar7 = std::operator<<(poVar7,(string *)&localToplevel);
        poVar7 = std::operator<<(poVar7,">.");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x8b,(char *)archive.Stream);
        std::__cxx11::string::~string((string *)&archive);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
        goto LAB_00162462;
      }
      cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,this->Compress,&this->ArchiveFormat);
      sVar4 = archive.Error._M_string_length;
      if (archive.Error._M_string_length == 0) {
        p_Var3 = p_Var9[5]._M_left;
        for (p_Var8 = p_Var9[5]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8->_M_parent)
        {
          addOneComponentToArchive(this,&archive,*(cmCPackComponent **)p_Var8);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
        poVar7 = std::operator<<(poVar7,(string *)&localToplevel);
        poVar7 = std::operator<<(poVar7,">, ERROR = ");
        std::__cxx11::string::string((string *)&packageFileName,(string *)&archive.Error);
        poVar7 = std::operator<<(poVar7,(string *)&packageFileName);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&packageFileName);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x8b,packageFileName._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&packageFileName);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      cmArchiveWrite::~cmArchiveWrite(&archive);
      cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
      if (sVar4 != 0) goto LAB_00162462;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &localToplevel);
      std::__cxx11::string::~string((string *)&localToplevel);
    }
    for (p_Var8 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var8 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      if (*(long *)(p_Var8 + 4) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
        poVar7 = std::operator<<((ostream *)&gf,"Component <");
        poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 2));
        poVar7 = std::operator<<(poVar7,"> does not belong to any group, package it separately.");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x9e,_cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gf,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&cmCPackLog_msg);
        pcVar6 = cmCPackGenerator::GetOption
                           (&this->super_cmCPackGenerator,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf
                           );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&localToplevel,pcVar6,(allocator<char> *)&archive);
        std::__cxx11::string::~string((string *)&gf);
        std::__cxx11::string::string((string *)&packageFileName,(string *)psVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        std::__cxx11::string::append((string *)&localToplevel);
        std::__cxx11::string::~string((string *)&gf);
        GetArchiveComponentFileName((string *)&cmCPackLog_msg,this,(string *)(p_Var8 + 1),false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                       (string *)&cmCPackLog_msg);
        std::__cxx11::string::append((string *)&packageFileName);
        std::__cxx11::string::~string((string *)&gf);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
        cmGeneratedFileStream::Open(&gf,&packageFileName,false,true);
        iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&gf);
        if (iVar5 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "Problem to generate Header for archive <");
          poVar7 = std::operator<<(poVar7,(string *)&packageFileName);
          poVar7 = std::operator<<(poVar7,">.");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xa8,(char *)archive.Stream);
          goto LAB_00162380;
        }
        cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,this->Compress,&this->ArchiveFormat);
        sVar4 = archive.Error._M_string_length;
        if (archive.Error._M_string_length == 0) {
          addOneComponentToArchive(this,&archive,(cmCPackComponent *)(p_Var8 + 2));
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
          poVar7 = std::operator<<(poVar7,(string *)&packageFileName);
          poVar7 = std::operator<<(poVar7,">, ERROR = ");
          std::__cxx11::string::string((string *)local_4f0,(string *)&archive.Error);
          poVar7 = std::operator<<(poVar7,(string *)local_4f0);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string((string *)local_4f0);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xa8,local_4f0[0]);
          std::__cxx11::string::~string((string *)local_4f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        }
        cmArchiveWrite::~cmArchiveWrite(&archive);
        cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
        if (sVar4 != 0) goto LAB_001623a7;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &packageFileName);
        std::__cxx11::string::~string((string *)&packageFileName);
        std::__cxx11::string::~string((string *)&localToplevel);
      }
    }
  }
  else {
    for (p_Var8 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var8 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gf,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&cmCPackLog_msg);
      pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&localToplevel,pcVar6,(allocator<char> *)&archive);
      std::__cxx11::string::~string((string *)&gf);
      std::__cxx11::string::string
                ((string *)&packageFileName,(string *)&(this->super_cmCPackGenerator).toplevel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
      std::__cxx11::string::append((string *)&localToplevel);
      std::__cxx11::string::~string((string *)&gf);
      GetArchiveComponentFileName((string *)&cmCPackLog_msg,this,(string *)(p_Var8 + 1),false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf,"/",
                     (string *)&cmCPackLog_msg);
      std::__cxx11::string::append((string *)&packageFileName);
      std::__cxx11::string::~string((string *)&gf);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
      cmGeneratedFileStream::Open(&gf,&packageFileName,false,true);
      iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gf);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Problem to generate Header for archive <");
        poVar7 = std::operator<<(poVar7,(string *)&packageFileName);
        poVar7 = std::operator<<(poVar7,">.");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0xbd,(char *)archive.Stream);
LAB_00162380:
        std::__cxx11::string::~string((string *)&archive);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
LAB_001623a7:
        std::__cxx11::string::~string((string *)&packageFileName);
LAB_00162462:
        std::__cxx11::string::~string((string *)&localToplevel);
        return 0;
      }
      cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,this->Compress,&this->ArchiveFormat);
      sVar4 = archive.Error._M_string_length;
      if (archive.Error._M_string_length == 0) {
        addOneComponentToArchive(this,&archive,(cmCPackComponent *)(p_Var8 + 2));
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem to create archive <");
        poVar7 = std::operator<<(poVar7,(string *)&packageFileName);
        poVar7 = std::operator<<(poVar7,">, ERROR = ");
        std::__cxx11::string::string((string *)local_4f0,(string *)&archive.Error);
        poVar7 = std::operator<<(poVar7,(string *)local_4f0);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)local_4f0);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0xbd,local_4f0[0]);
        std::__cxx11::string::~string((string *)local_4f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      cmArchiveWrite::~cmArchiveWrite(&archive);
      cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
      if (sVar4 != 0) goto LAB_001623a7;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &packageFileName);
      std::__cxx11::string::~string((string *)&packageFileName);
      std::__cxx11::string::~string((string *)&localToplevel);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, comp);
        }
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, &(comp.second));
        }
        // add the generated package to package file names list
        packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        addOneComponentToArchive(archive, &(comp.second));
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}